

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  RayK<4> *pRVar2;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  float fVar6;
  float fVar7;
  size_t k;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  undefined4 uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  NodeRef *pNVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar38;
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 ai;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 bi_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar60;
  float fVar61;
  vint4 bi_2;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  vint4 bi_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 ai_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 ai_3;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vint4 bi;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar95;
  undefined1 auVar96 [16];
  uint uVar98;
  uint uVar99;
  uint uVar100;
  undefined1 auVar97 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  Precalculations pre;
  undefined1 local_37f8 [16];
  undefined1 local_37e8 [16];
  Geometry *local_37d0;
  undefined1 local_37c8 [8];
  float fStack_37c0;
  float fStack_37bc;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_3778 [16];
  undefined1 local_3768 [16];
  undefined8 local_3718;
  undefined8 uStack_3710;
  RTCHitN local_3708 [16];
  undefined1 local_36f8 [16];
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  undefined1 local_36c8 [16];
  undefined1 local_36b8 [16];
  undefined1 local_36a8 [16];
  uint local_3698;
  uint uStack_3694;
  uint uStack_3690;
  uint uStack_368c;
  uint uStack_3688;
  uint uStack_3684;
  uint uStack_3680;
  uint uStack_367c;
  undefined8 local_3678;
  undefined8 uStack_3670;
  undefined8 local_3668;
  undefined8 uStack_3660;
  undefined1 local_3658 [16];
  undefined1 local_3648 [16];
  float local_3638;
  float fStack_3634;
  float fStack_3630;
  float fStack_362c;
  float local_3628;
  float fStack_3624;
  float fStack_3620;
  float fStack_361c;
  float local_3618;
  float fStack_3614;
  float fStack_3610;
  float fStack_360c;
  float local_3608;
  float fStack_3604;
  float fStack_3600;
  float fStack_35fc;
  float local_35f8;
  float fStack_35f4;
  float fStack_35f0;
  float fStack_35ec;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar49 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar57 = vpcmpeqd_avx(auVar49,(undefined1  [16])valid_i->field_0);
    auVar37 = ZEXT816(0) << 0x40;
    auVar50 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar37,5);
    auVar55 = auVar57 & auVar50;
    if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar55[0xf] < '\0')
    {
      local_3658 = vandps_avx(auVar50,auVar57);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar101._8_4_ = 0x7fffffff;
      auVar101._0_8_ = 0x7fffffff7fffffff;
      auVar101._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar89._8_4_ = 0x219392ef;
      auVar89._0_8_ = 0x219392ef219392ef;
      auVar89._12_4_ = 0x219392ef;
      auVar50 = vcmpps_avx(auVar50,auVar89,1);
      auVar57 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar89,auVar50);
      auVar50 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar89,1);
      auVar55 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar89,auVar50);
      auVar50 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar101);
      auVar50 = vcmpps_avx(auVar50,auVar89,1);
      auVar50 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar89,auVar50);
      auVar63 = vrcpps_avx(auVar57);
      auVar90._8_4_ = 0x3f800000;
      auVar90._0_8_ = 0x3f8000003f800000;
      auVar90._12_4_ = 0x3f800000;
      auVar57 = vfnmadd213ps_fma(auVar57,auVar63,auVar90);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar57,auVar63,auVar63)
      ;
      auVar57 = vrcpps_avx(auVar55);
      auVar55 = vfnmadd213ps_fma(auVar55,auVar57,auVar90);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar55,auVar57,auVar57)
      ;
      auVar57 = vrcpps_avx(auVar50);
      auVar50 = vfnmadd213ps_fma(auVar50,auVar57,auVar90);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar50,auVar57,auVar57)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar37,1);
      auVar57._8_4_ = 0x20;
      auVar57._0_8_ = 0x2000000020;
      auVar57._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar57);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar37,5);
      auVar55._8_4_ = 0x40;
      auVar55._0_8_ = 0x4000000040;
      auVar55._12_4_ = 0x40;
      auVar63._8_4_ = 0x60;
      auVar63._0_8_ = 0x6000000060;
      auVar63._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar63,auVar55,auVar50);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar37,5);
      auVar64._8_4_ = 0x80;
      auVar64._0_8_ = 0x8000000080;
      auVar64._12_4_ = 0x80;
      auVar71._8_4_ = 0xa0;
      auVar71._0_8_ = 0xa0000000a0;
      auVar71._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar71,auVar64,auVar50);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar37);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar37);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar103 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,local_3658);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar57,local_3658);
      terminated.field_0.i[1] = local_3658._4_4_ ^ auVar49._4_4_;
      terminated.field_0.i[0] = local_3658._0_4_ ^ auVar49._0_4_;
      terminated.field_0.i[2] = local_3658._8_4_ ^ auVar49._8_4_;
      terminated.field_0.i[3] = local_3658._12_4_ ^ auVar49._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 3;
      }
      else {
        uVar26 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar27 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_3668 = mm_lookupmask_ps._0_8_;
      uStack_3660 = mm_lookupmask_ps._8_8_;
      local_3678 = mm_lookupmask_ps._240_8_;
      uStack_3670 = mm_lookupmask_ps._248_8_;
      auVar50 = vpcmpeqd_avx(local_3658,local_3658);
      auVar97 = ZEXT1664(auVar50);
LAB_005a828c:
      do {
        do {
          root.ptr = pNVar28[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005a911d;
          pNVar28 = pNVar28 + -1;
          paVar27 = paVar27 + -1;
          aVar39 = *paVar27;
          auVar50 = vcmpps_avx((undefined1  [16])aVar39,(undefined1  [16])tray.tfar.field_0,1);
          uVar18 = vmovmskps_avx(auVar50);
        } while (uVar18 == 0);
        uVar24 = (ulong)(uVar18 & 0xff);
        uVar18 = POPCOUNT(uVar18 & 0xff);
        if (uVar26 < uVar18) {
LAB_005a82ca:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005a911d;
              auVar50 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar39,6);
              if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar50[0xf]) goto LAB_005a828c;
              uVar24 = (ulong)((uint)root.ptr & 0xf);
              aVar38 = terminated.field_0;
              if (uVar24 == 8) goto LAB_005a9008;
              lVar22 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar25 = 0;
              auVar50 = auVar97._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_005a849c;
            }
            lVar22 = 0;
            uVar24 = 8;
            aVar39 = auVar103._0_16_;
            do {
              uVar25 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar22 * 8);
              if (uVar25 == 8) break;
              uVar19 = *(undefined4 *)(root.ptr + 0x40 + lVar22 * 4);
              auVar37._4_4_ = uVar19;
              auVar37._0_4_ = uVar19;
              auVar37._8_4_ = uVar19;
              auVar37._12_4_ = uVar19;
              auVar8._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar8._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar8._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar8._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar57 = vfmsub213ps_fma(auVar37,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar8);
              uVar19 = *(undefined4 *)(root.ptr + 0x80 + lVar22 * 4);
              auVar72._4_4_ = uVar19;
              auVar72._0_4_ = uVar19;
              auVar72._8_4_ = uVar19;
              auVar72._12_4_ = uVar19;
              auVar9._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar9._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar9._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar9._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar55 = vfmsub213ps_fma(auVar72,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar9);
              uVar19 = *(undefined4 *)(root.ptr + 0xc0 + lVar22 * 4);
              auVar82._4_4_ = uVar19;
              auVar82._0_4_ = uVar19;
              auVar82._8_4_ = uVar19;
              auVar82._12_4_ = uVar19;
              auVar10._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar10._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar10._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar10._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar37 = vfmsub213ps_fma(auVar82,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar10);
              uVar19 = *(undefined4 *)(root.ptr + 0x60 + lVar22 * 4);
              auVar91._4_4_ = uVar19;
              auVar91._0_4_ = uVar19;
              auVar91._8_4_ = uVar19;
              auVar91._12_4_ = uVar19;
              auVar63 = vfmsub213ps_fma(auVar91,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar8);
              uVar19 = *(undefined4 *)(root.ptr + 0xa0 + lVar22 * 4);
              auVar65._4_4_ = uVar19;
              auVar65._0_4_ = uVar19;
              auVar65._8_4_ = uVar19;
              auVar65._12_4_ = uVar19;
              auVar64 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar9);
              uVar19 = *(undefined4 *)(root.ptr + 0xe0 + lVar22 * 4);
              auVar51._4_4_ = uVar19;
              auVar51._0_4_ = uVar19;
              auVar51._8_4_ = uVar19;
              auVar51._12_4_ = uVar19;
              auVar71 = vfmsub213ps_fma(auVar51,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar10);
              auVar50 = vpminsd_avx(auVar57,auVar63);
              auVar49 = vpminsd_avx(auVar55,auVar64);
              auVar50 = vpmaxsd_avx(auVar50,auVar49);
              auVar49 = vpminsd_avx(auVar37,auVar71);
              auVar49 = vpmaxsd_avx(auVar50,auVar49);
              auVar50 = vpmaxsd_avx(auVar57,auVar63);
              auVar57 = vpmaxsd_avx(auVar55,auVar64);
              auVar57 = vpminsd_avx(auVar50,auVar57);
              auVar50 = vpmaxsd_avx(auVar37,auVar71);
              auVar57 = vpminsd_avx(auVar57,auVar50);
              auVar50 = vpmaxsd_avx(auVar49,(undefined1  [16])tray.tnear.field_0);
              auVar57 = vpminsd_avx(auVar57,(undefined1  [16])tray.tfar.field_0);
              auVar50 = vcmpps_avx(auVar50,auVar57,2);
              uVar23 = uVar24;
              aVar5 = aVar39;
              if (((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar50[0xf] < '\0') &&
                 (aVar5.v = (__m128)vblendvps_avx(auVar103._0_16_,auVar49,auVar50), uVar23 = uVar25,
                 uVar24 != 8)) {
                pNVar28->ptr = uVar24;
                pNVar28 = pNVar28 + 1;
                *paVar27 = aVar39;
                paVar27 = paVar27 + 1;
              }
              aVar39 = aVar5;
              uVar24 = uVar23;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 8);
            if (uVar24 == 8) goto LAB_005a8ff3;
            auVar50 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar39,6);
            uVar19 = vmovmskps_avx(auVar50);
            root.ptr = uVar24;
          } while ((byte)uVar26 < (byte)POPCOUNT(uVar19));
          pNVar28->ptr = uVar24;
          pNVar28 = pNVar28 + 1;
          *paVar27 = aVar39;
          paVar27 = paVar27 + 1;
LAB_005a8ff3:
          iVar20 = 4;
        }
        else {
          do {
            k = 0;
            for (uVar25 = uVar24; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar97 = ZEXT1664(auVar97._0_16_);
            bVar29 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar29) {
              terminated.field_0.i[k] = -1;
            }
            uVar24 = uVar24 - 1 & uVar24;
          } while (uVar24 != 0);
          auVar50 = vpcmpeqd_avx(auVar97._0_16_,auVar97._0_16_);
          auVar97 = ZEXT1664(auVar50);
          auVar50 = auVar50 & ~(undefined1  [16])terminated.field_0;
          iVar20 = 3;
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar49._8_4_ = 0xff800000;
            auVar49._0_8_ = 0xff800000ff800000;
            auVar49._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar49,
                               (undefined1  [16])terminated.field_0);
            iVar20 = 2;
          }
          auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if (uVar26 < uVar18) goto LAB_005a82ca;
        }
      } while (iVar20 != 3);
LAB_005a911d:
      auVar50 = vandps_avx(local_3658,(undefined1  [16])terminated.field_0);
      auVar43._8_4_ = 0xff800000;
      auVar43._0_8_ = 0xff800000ff800000;
      auVar43._12_4_ = 0xff800000;
      auVar50 = vmaskmovps_avx(auVar50,auVar43);
      *(undefined1 (*) [16])pRVar1 = auVar50;
    }
  }
  return;
  while( true ) {
    uVar25 = uVar25 + 1;
    lVar22 = lVar22 + 0xe0;
    auVar50 = auVar57;
    if (uVar24 - 8 <= uVar25) break;
LAB_005a849c:
    lVar21 = uVar25 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar23 = 0;
    auVar49 = auVar50;
    while( true ) {
      uVar18 = *(uint *)(lVar22 + uVar23 * 4);
      if ((ulong)uVar18 == 0xffffffff) break;
      fVar56 = *(float *)(lVar22 + -0xc0 + uVar23 * 4);
      auVar73._4_4_ = fVar56;
      auVar73._0_4_ = fVar56;
      auVar73._8_4_ = fVar56;
      auVar73._12_4_ = fVar56;
      fVar60 = *(float *)(lVar22 + -0xb0 + uVar23 * 4);
      auVar77._4_4_ = fVar60;
      auVar77._0_4_ = fVar60;
      auVar77._8_4_ = fVar60;
      auVar77._12_4_ = fVar60;
      fVar61 = *(float *)(lVar22 + -0xa0 + uVar23 * 4);
      auVar66._4_4_ = fVar61;
      auVar66._0_4_ = fVar61;
      auVar66._8_4_ = fVar61;
      auVar66._12_4_ = fVar61;
      local_37c8._4_4_ = *(float *)(lVar22 + -0x90 + uVar23 * 4);
      local_35f8 = *(float *)(lVar22 + -0x80 + uVar23 * 4);
      local_3608 = *(float *)(lVar22 + -0x70 + uVar23 * 4);
      local_37f8._4_4_ = *(undefined4 *)(lVar22 + -0x60 + uVar23 * 4);
      local_37f8._0_4_ = local_37f8._4_4_;
      local_37f8._8_4_ = local_37f8._4_4_;
      local_37f8._12_4_ = local_37f8._4_4_;
      local_3768._4_4_ = *(undefined4 *)(lVar22 + -0x50 + uVar23 * 4);
      local_3768._0_4_ = local_3768._4_4_;
      local_3768._8_4_ = local_3768._4_4_;
      local_3768._12_4_ = local_3768._4_4_;
      local_3778._4_4_ = *(undefined4 *)(lVar22 + -0x40 + uVar23 * 4);
      local_3778._0_4_ = local_3778._4_4_;
      local_3778._8_4_ = local_3778._4_4_;
      local_3778._12_4_ = local_3778._4_4_;
      local_3618 = *(float *)(lVar22 + -0x30 + uVar23 * 4);
      local_3628 = *(float *)(lVar22 + -0x20 + uVar23 * 4);
      local_3638 = *(float *)(lVar22 + -0x10 + uVar23 * 4);
      local_3718 = *(undefined8 *)(lVar21 + 0xd0);
      uStack_3710 = *(undefined8 *)(lVar21 + 0xd8);
      local_37c8._0_4_ = local_37c8._4_4_;
      fStack_37c0 = (float)local_37c8._4_4_;
      fStack_37bc = (float)local_37c8._4_4_;
      fVar6 = fVar56 - (float)local_37c8._4_4_;
      fStack_3604 = local_3608;
      fStack_3600 = local_3608;
      fStack_35fc = local_3608;
      fVar7 = fVar61 - local_3608;
      auVar92._4_4_ = fVar7;
      auVar92._0_4_ = fVar7;
      auVar92._8_4_ = fVar7;
      auVar92._12_4_ = fVar7;
      fStack_3614 = local_3618;
      fStack_3610 = local_3618;
      fStack_360c = local_3618;
      fVar56 = local_3618 - fVar56;
      fVar62 = fVar7 * fVar56;
      auVar96._4_4_ = fVar56;
      auVar96._0_4_ = fVar56;
      auVar96._8_4_ = fVar56;
      auVar96._12_4_ = fVar56;
      auVar106._4_4_ = fVar6;
      auVar106._0_4_ = fVar6;
      auVar106._8_4_ = fVar6;
      auVar106._12_4_ = fVar6;
      fStack_3624 = local_3628;
      fStack_3620 = local_3628;
      fStack_361c = local_3628;
      fVar56 = local_3628 - fVar60;
      fVar6 = fVar6 * fVar56;
      auVar102._4_4_ = fVar56;
      auVar102._0_4_ = fVar56;
      auVar102._8_4_ = fVar56;
      auVar102._12_4_ = fVar56;
      fStack_35f4 = local_35f8;
      fStack_35f0 = local_35f8;
      fStack_35ec = local_35f8;
      fVar60 = fVar60 - local_35f8;
      auVar83._4_4_ = fVar60;
      auVar83._0_4_ = fVar60;
      auVar83._8_4_ = fVar60;
      auVar83._12_4_ = fVar60;
      fStack_3634 = local_3638;
      fStack_3630 = local_3638;
      fStack_362c = local_3638;
      fVar61 = local_3638 - fVar61;
      fVar60 = fVar60 * fVar61;
      auVar104._4_4_ = fVar61;
      auVar104._0_4_ = fVar61;
      auVar104._8_4_ = fVar61;
      auVar104._12_4_ = fVar61;
      auVar30._4_4_ = fVar60;
      auVar30._0_4_ = fVar60;
      auVar30._8_4_ = fVar60;
      auVar30._12_4_ = fVar60;
      auVar90 = vfmsub231ps_fma(auVar30,auVar102,auVar92);
      auVar40._4_4_ = fVar62;
      auVar40._0_4_ = fVar62;
      auVar40._8_4_ = fVar62;
      auVar40._12_4_ = fVar62;
      auVar8 = vfmsub231ps_fma(auVar40,auVar104,auVar106);
      auVar44._4_4_ = fVar6;
      auVar44._0_4_ = fVar6;
      auVar44._8_4_ = fVar6;
      auVar44._12_4_ = fVar6;
      auVar63 = vsubps_avx(auVar73,*(undefined1 (*) [16])ray);
      auVar64 = vsubps_avx(auVar77,*(undefined1 (*) [16])(ray + 0x10));
      auVar9 = vfmsub231ps_fma(auVar44,auVar96,auVar83);
      auVar71 = vsubps_avx(auVar66,*(undefined1 (*) [16])(ray + 0x20));
      auVar57 = *(undefined1 (*) [16])(ray + 0x40);
      auVar55 = *(undefined1 (*) [16])(ray + 0x50);
      auVar107._0_4_ = auVar57._0_4_ * auVar64._0_4_;
      auVar107._4_4_ = auVar57._4_4_ * auVar64._4_4_;
      auVar107._8_4_ = auVar57._8_4_ * auVar64._8_4_;
      auVar107._12_4_ = auVar57._12_4_ * auVar64._12_4_;
      auVar10 = vfmsub231ps_fma(auVar107,auVar63,auVar55);
      auVar37 = *(undefined1 (*) [16])(ray + 0x60);
      auVar87._0_4_ = auVar9._0_4_ * auVar37._0_4_;
      auVar87._4_4_ = auVar9._4_4_ * auVar37._4_4_;
      auVar87._8_4_ = auVar9._8_4_ * auVar37._8_4_;
      auVar87._12_4_ = auVar9._12_4_ * auVar37._12_4_;
      auVar89 = vfmadd231ps_fma(auVar87,auVar8,auVar55);
      auVar109._0_4_ = auVar71._0_4_ * auVar55._0_4_;
      auVar109._4_4_ = auVar71._4_4_ * auVar55._4_4_;
      auVar109._8_4_ = auVar71._8_4_ * auVar55._8_4_;
      auVar109._12_4_ = auVar71._12_4_ * auVar55._12_4_;
      auVar51 = vfmsub231ps_fma(auVar109,auVar64,auVar37);
      auVar52._0_4_ = auVar37._0_4_ * auVar63._0_4_;
      auVar52._4_4_ = auVar37._4_4_ * auVar63._4_4_;
      auVar52._8_4_ = auVar37._8_4_ * auVar63._8_4_;
      auVar52._12_4_ = auVar37._12_4_ * auVar63._12_4_;
      auVar65 = vfmsub231ps_fma(auVar52,auVar71,auVar57);
      auVar89 = vfmadd231ps_fma(auVar89,auVar90,auVar57);
      auVar58._0_4_ = fVar61 * auVar10._0_4_;
      auVar58._4_4_ = fVar61 * auVar10._4_4_;
      auVar58._8_4_ = fVar61 * auVar10._8_4_;
      auVar58._12_4_ = fVar61 * auVar10._12_4_;
      auVar57 = vfmadd231ps_fma(auVar58,auVar65,auVar102);
      auVar55 = vfmadd231ps_fma(auVar57,auVar51,auVar96);
      local_3648._8_4_ = 0x80000000;
      local_3648._0_8_ = 0x8000000080000000;
      local_3648._12_4_ = 0x80000000;
      auVar57 = vandps_avx(auVar89,local_3648);
      uVar95 = auVar57._0_4_;
      auVar67._0_4_ = (float)(uVar95 ^ auVar55._0_4_);
      uVar98 = auVar57._4_4_;
      auVar67._4_4_ = (float)(uVar98 ^ auVar55._4_4_);
      uVar99 = auVar57._8_4_;
      auVar67._8_4_ = (float)(uVar99 ^ auVar55._8_4_);
      uVar100 = auVar57._12_4_;
      auVar67._12_4_ = (float)(uVar100 ^ auVar55._12_4_);
      auVar55 = vcmpps_avx(auVar67,_DAT_01f7aa10,5);
      auVar37 = auVar49 & auVar55;
      if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0'
         ) {
        auVar55 = vandps_avx(auVar55,auVar49);
        auVar59._0_4_ = auVar10._0_4_ * fVar7;
        auVar59._4_4_ = auVar10._4_4_ * fVar7;
        auVar59._8_4_ = auVar10._8_4_ * fVar7;
        auVar59._12_4_ = auVar10._12_4_ * fVar7;
        auVar37 = vfmadd213ps_fma(auVar83,auVar65,auVar59);
        auVar37 = vfmadd213ps_fma(auVar106,auVar51,auVar37);
        auVar85._0_4_ = (float)(uVar95 ^ auVar37._0_4_);
        auVar85._4_4_ = (float)(uVar98 ^ auVar37._4_4_);
        auVar85._8_4_ = (float)(uVar99 ^ auVar37._8_4_);
        auVar85._12_4_ = (float)(uVar100 ^ auVar37._12_4_);
        auVar37 = vcmpps_avx(auVar85,_DAT_01f7aa10,5);
        auVar10 = auVar55 & auVar37;
        if ((((auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar10[0xf] < '\0') {
          auVar10 = vandps_avx(auVar89,auVar101);
          auVar55 = vandps_avx(auVar55,auVar37);
          auVar37 = vsubps_avx(auVar10,auVar67);
          auVar37 = vcmpps_avx(auVar37,auVar85,5);
          auVar51 = auVar55 & auVar37;
          if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar51[0xf] < '\0') {
            auVar55 = vandps_avx(auVar37,auVar55);
            auVar93._0_4_ = auVar71._0_4_ * auVar9._0_4_;
            auVar93._4_4_ = auVar71._4_4_ * auVar9._4_4_;
            auVar93._8_4_ = auVar71._8_4_ * auVar9._8_4_;
            auVar93._12_4_ = auVar71._12_4_ * auVar9._12_4_;
            auVar37 = vfmadd213ps_fma(auVar64,auVar8,auVar93);
            auVar37 = vfmadd213ps_fma(auVar63,auVar90,auVar37);
            auVar75._0_4_ = (float)(uVar95 ^ auVar37._0_4_);
            auVar75._4_4_ = (float)(uVar98 ^ auVar37._4_4_);
            auVar75._8_4_ = (float)(uVar99 ^ auVar37._8_4_);
            auVar75._12_4_ = (float)(uVar100 ^ auVar37._12_4_);
            auVar78._0_4_ = auVar10._0_4_ * *(float *)(ray + 0x30);
            auVar78._4_4_ = auVar10._4_4_ * *(float *)(ray + 0x34);
            auVar78._8_4_ = auVar10._8_4_ * *(float *)(ray + 0x38);
            auVar78._12_4_ = auVar10._12_4_ * *(float *)(ray + 0x3c);
            auVar37 = vcmpps_avx(auVar78,auVar75,1);
            pRVar2 = ray + 0x80;
            auVar64 = *(undefined1 (*) [16])pRVar2;
            auVar94._0_4_ = *(float *)pRVar2 * auVar10._0_4_;
            auVar94._4_4_ = *(float *)(ray + 0x84) * auVar10._4_4_;
            auVar94._8_4_ = *(float *)(ray + 0x88) * auVar10._8_4_;
            auVar94._12_4_ = *(float *)(ray + 0x8c) * auVar10._12_4_;
            auVar63 = vcmpps_avx(auVar75,auVar94,2);
            auVar37 = vandps_avx(auVar63,auVar37);
            auVar63 = auVar55 & auVar37;
            if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar63[0xf] < '\0') {
              auVar55 = vandps_avx(auVar37,auVar55);
              auVar37 = vcmpps_avx(auVar89,_DAT_01f7aa10,4);
              auVar63 = auVar55 & auVar37;
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar63[0xf] < '\0') {
                auVar55 = vandps_avx(auVar37,auVar55);
                local_37d0 = (context->scene->geometries).items[uVar18].ptr;
                uVar95 = local_37d0->mask;
                auVar79._4_4_ = uVar95;
                auVar79._0_4_ = uVar95;
                auVar79._8_4_ = uVar95;
                auVar79._12_4_ = uVar95;
                auVar37 = vpand_avx(auVar79,*(undefined1 (*) [16])(ray + 0x90));
                auVar37 = vpcmpeqd_avx(auVar37,_DAT_01f7aa10);
                auVar63 = auVar55 & ~auVar37;
                if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar63[0xf] < '\0') {
                  uVar19 = *(undefined4 *)((long)&local_3718 + uVar23 * 4);
                  auVar55 = vandnps_avx(auVar37,auVar55);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (local_37d0->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar37 = vrcpps_avx(auVar10);
                    auVar88._8_4_ = 0x3f800000;
                    auVar88._0_8_ = 0x3f8000003f800000;
                    auVar88._12_4_ = 0x3f800000;
                    auVar63 = vfnmadd213ps_fma(auVar10,auVar37,auVar88);
                    auVar37 = vfmadd132ps_fma(auVar63,auVar37,auVar37);
                    fVar56 = auVar37._0_4_;
                    auVar69._0_4_ = fVar56 * auVar67._0_4_;
                    fVar60 = auVar37._4_4_;
                    auVar69._4_4_ = fVar60 * auVar67._4_4_;
                    fVar61 = auVar37._8_4_;
                    auVar69._8_4_ = fVar61 * auVar67._8_4_;
                    fVar62 = auVar37._12_4_;
                    auVar69._12_4_ = fVar62 * auVar67._12_4_;
                    auVar37 = vminps_avx(auVar69,auVar88);
                    auVar81._0_4_ = auVar85._0_4_ * fVar56;
                    auVar81._4_4_ = auVar85._4_4_ * fVar60;
                    auVar81._8_4_ = auVar85._8_4_ * fVar61;
                    auVar81._12_4_ = auVar85._12_4_ * fVar62;
                    auVar63 = vminps_avx(auVar81,auVar88);
                    auVar71 = vsubps_avx(auVar88,auVar37);
                    auVar89 = vsubps_avx(auVar88,auVar63);
                    auVar12._8_8_ = uStack_3660;
                    auVar12._0_8_ = local_3668;
                    local_36d8 = vblendvps_avx(auVar37,auVar71,auVar12);
                    local_36c8 = vblendvps_avx(auVar63,auVar89,auVar12);
                    local_36a8._4_4_ = uVar18;
                    local_36a8._0_4_ = uVar18;
                    local_36a8._8_4_ = uVar18;
                    local_36a8._12_4_ = uVar18;
                    local_36b8._4_4_ = uVar19;
                    local_36b8._0_4_ = uVar19;
                    local_36b8._8_4_ = uVar19;
                    local_36b8._12_4_ = uVar19;
                    local_3708[0] = (RTCHitN)auVar90[0];
                    local_3708[1] = (RTCHitN)auVar90[1];
                    local_3708[2] = (RTCHitN)auVar90[2];
                    local_3708[3] = (RTCHitN)auVar90[3];
                    local_3708[4] = (RTCHitN)auVar90[4];
                    local_3708[5] = (RTCHitN)auVar90[5];
                    local_3708[6] = (RTCHitN)auVar90[6];
                    local_3708[7] = (RTCHitN)auVar90[7];
                    local_3708[8] = (RTCHitN)auVar90[8];
                    local_3708[9] = (RTCHitN)auVar90[9];
                    local_3708[10] = (RTCHitN)auVar90[10];
                    local_3708[0xb] = (RTCHitN)auVar90[0xb];
                    local_3708[0xc] = (RTCHitN)auVar90[0xc];
                    local_3708[0xd] = (RTCHitN)auVar90[0xd];
                    local_3708[0xe] = (RTCHitN)auVar90[0xe];
                    local_3708[0xf] = (RTCHitN)auVar90[0xf];
                    local_36f8 = auVar8;
                    local_36e8 = auVar9;
                    vpcmpeqd_avx2(ZEXT1632(auVar90),ZEXT1632(auVar90));
                    uStack_3694 = context->user->instID[0];
                    local_3698 = uStack_3694;
                    uStack_3690 = uStack_3694;
                    uStack_368c = uStack_3694;
                    uStack_3688 = context->user->instPrimID[0];
                    auVar41._0_4_ = fVar56 * auVar75._0_4_;
                    auVar41._4_4_ = fVar60 * auVar75._4_4_;
                    auVar41._8_4_ = fVar61 * auVar75._8_4_;
                    auVar41._12_4_ = fVar62 * auVar75._12_4_;
                    uStack_3684 = uStack_3688;
                    uStack_3680 = uStack_3688;
                    uStack_367c = uStack_3688;
                    auVar37 = vblendvps_avx(*(undefined1 (*) [16])pRVar2,auVar41,auVar55);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar37;
                    args.valid = (int *)local_37e8;
                    args.geometryUserPtr = local_37d0->userPtr;
                    args.context = context->user;
                    args.hit = local_3708;
                    args.N = 4;
                    local_37e8 = auVar55;
                    args.ray = (RTCRayN *)ray;
                    if (local_37d0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*local_37d0->occlusionFilterN)(&args);
                    }
                    if (local_37e8 == (undefined1  [16])0x0) {
                      auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar55 = auVar55 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_37d0->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar37 = vpcmpeqd_avx(local_37e8,_DAT_01f7aa10);
                      auVar55 = auVar37 ^ _DAT_01f7ae20;
                      auVar46._8_4_ = 0xff800000;
                      auVar46._0_8_ = 0xff800000ff800000;
                      auVar46._12_4_ = 0xff800000;
                      auVar37 = vblendvps_avx(auVar46,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar37);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar37;
                    }
                    auVar37 = vpslld_avx(auVar55,0x1f);
                    auVar55 = vpsrad_avx(auVar37,0x1f);
                    auVar37 = vblendvps_avx(auVar64,*(undefined1 (*) [16])pRVar1,auVar37);
                    *(undefined1 (*) [16])pRVar1 = auVar37;
                  }
                  auVar49 = vpandn_avx(auVar55,auVar49);
                }
              }
            }
          }
        }
      }
      if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar49[0xf])
      {
        auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar57 = vpcmpeqd_avx(auVar57,auVar57);
        auVar97 = ZEXT1664(auVar57);
        break;
      }
      auVar15._4_4_ = fStack_3614;
      auVar15._0_4_ = local_3618;
      auVar15._8_4_ = fStack_3610;
      auVar15._12_4_ = fStack_360c;
      auVar63 = vsubps_avx(local_37f8,auVar15);
      auVar14._4_4_ = fStack_3624;
      auVar14._0_4_ = local_3628;
      auVar14._8_4_ = fStack_3620;
      auVar14._12_4_ = fStack_361c;
      auVar64 = vsubps_avx(local_3768,auVar14);
      auVar13._4_4_ = fStack_3634;
      auVar13._0_4_ = local_3638;
      auVar13._8_4_ = fStack_3630;
      auVar13._12_4_ = fStack_362c;
      auVar71 = vsubps_avx(local_3778,auVar13);
      auVar89 = vsubps_avx(_local_37c8,local_37f8);
      auVar17._4_4_ = fStack_35f4;
      auVar17._0_4_ = local_35f8;
      auVar17._8_4_ = fStack_35f0;
      auVar17._12_4_ = fStack_35ec;
      auVar90 = vsubps_avx(auVar17,local_3768);
      auVar16._4_4_ = fStack_3604;
      auVar16._0_4_ = local_3608;
      auVar16._8_4_ = fStack_3600;
      auVar16._12_4_ = fStack_35fc;
      auVar8 = vsubps_avx(auVar16,local_3778);
      auVar45._0_4_ = auVar64._0_4_ * auVar8._0_4_;
      auVar45._4_4_ = auVar64._4_4_ * auVar8._4_4_;
      auVar45._8_4_ = auVar64._8_4_ * auVar8._8_4_;
      auVar45._12_4_ = auVar64._12_4_ * auVar8._12_4_;
      auVar72 = vfmsub231ps_fma(auVar45,auVar90,auVar71);
      auVar53._0_4_ = auVar71._0_4_ * auVar89._0_4_;
      auVar53._4_4_ = auVar71._4_4_ * auVar89._4_4_;
      auVar53._8_4_ = auVar71._8_4_ * auVar89._8_4_;
      auVar53._12_4_ = auVar71._12_4_ * auVar89._12_4_;
      auVar82 = vfmsub231ps_fma(auVar53,auVar8,auVar63);
      auVar74._0_4_ = auVar90._0_4_ * auVar63._0_4_;
      auVar74._4_4_ = auVar90._4_4_ * auVar63._4_4_;
      auVar74._8_4_ = auVar90._8_4_ * auVar63._8_4_;
      auVar74._12_4_ = auVar90._12_4_ * auVar63._12_4_;
      auVar9 = vsubps_avx(local_37f8,*(undefined1 (*) [16])ray);
      auVar10 = vsubps_avx(local_3768,*(undefined1 (*) [16])(ray + 0x10));
      auVar51 = vsubps_avx(local_3778,*(undefined1 (*) [16])(ray + 0x20));
      auVar91 = vfmsub231ps_fma(auVar74,auVar89,auVar64);
      auVar57 = *(undefined1 (*) [16])(ray + 0x40);
      auVar55 = *(undefined1 (*) [16])(ray + 0x50);
      auVar105._0_4_ = auVar57._0_4_ * auVar10._0_4_;
      auVar105._4_4_ = auVar57._4_4_ * auVar10._4_4_;
      auVar105._8_4_ = auVar57._8_4_ * auVar10._8_4_;
      auVar105._12_4_ = auVar57._12_4_ * auVar10._12_4_;
      auVar30 = vfmsub231ps_fma(auVar105,auVar9,auVar55);
      auVar37 = *(undefined1 (*) [16])(ray + 0x60);
      auVar84._0_4_ = auVar37._0_4_ * auVar91._0_4_;
      auVar84._4_4_ = auVar37._4_4_ * auVar91._4_4_;
      auVar84._8_4_ = auVar37._8_4_ * auVar91._8_4_;
      auVar84._12_4_ = auVar37._12_4_ * auVar91._12_4_;
      auVar65 = vfmadd231ps_fma(auVar84,auVar82,auVar55);
      auVar108._0_4_ = auVar55._0_4_ * auVar51._0_4_;
      auVar108._4_4_ = auVar55._4_4_ * auVar51._4_4_;
      auVar108._8_4_ = auVar55._8_4_ * auVar51._8_4_;
      auVar108._12_4_ = auVar55._12_4_ * auVar51._12_4_;
      auVar40 = vfmsub231ps_fma(auVar108,auVar10,auVar37);
      auVar110._0_4_ = auVar37._0_4_ * auVar9._0_4_;
      auVar110._4_4_ = auVar37._4_4_ * auVar9._4_4_;
      auVar110._8_4_ = auVar37._8_4_ * auVar9._8_4_;
      auVar110._12_4_ = auVar37._12_4_ * auVar9._12_4_;
      auVar44 = vfmsub231ps_fma(auVar110,auVar51,auVar57);
      auVar65 = vfmadd231ps_fma(auVar65,auVar72,auVar57);
      auVar31._0_4_ = auVar8._0_4_ * auVar30._0_4_;
      auVar31._4_4_ = auVar8._4_4_ * auVar30._4_4_;
      auVar31._8_4_ = auVar8._8_4_ * auVar30._8_4_;
      auVar31._12_4_ = auVar8._12_4_ * auVar30._12_4_;
      auVar55 = vfmadd231ps_fma(auVar31,auVar44,auVar90);
      auVar57 = vandps_avx(auVar65,local_3648);
      auVar55 = vfmadd231ps_fma(auVar55,auVar40,auVar89);
      uVar18 = auVar57._0_4_;
      auVar68._0_4_ = (float)(uVar18 ^ auVar55._0_4_);
      uVar95 = auVar57._4_4_;
      auVar68._4_4_ = (float)(uVar95 ^ auVar55._4_4_);
      uVar98 = auVar57._8_4_;
      auVar68._8_4_ = (float)(uVar98 ^ auVar55._8_4_);
      uVar99 = auVar57._12_4_;
      auVar68._12_4_ = (float)(uVar99 ^ auVar55._12_4_);
      auVar55 = vcmpps_avx(auVar68,_DAT_01f7aa10,5);
      auVar37 = auVar49 & auVar55;
      _local_37c8 = auVar63;
      if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0'
         ) {
        auVar55 = vandps_avx(auVar55,auVar49);
        auVar32._0_4_ = auVar71._0_4_ * auVar30._0_4_;
        auVar32._4_4_ = auVar71._4_4_ * auVar30._4_4_;
        auVar32._8_4_ = auVar71._8_4_ * auVar30._8_4_;
        auVar32._12_4_ = auVar71._12_4_ * auVar30._12_4_;
        auVar37 = vfmadd213ps_fma(auVar64,auVar44,auVar32);
        auVar37 = vfmadd213ps_fma(auVar63,auVar40,auVar37);
        auVar80._0_4_ = (float)(uVar18 ^ auVar37._0_4_);
        auVar80._4_4_ = (float)(uVar95 ^ auVar37._4_4_);
        auVar80._8_4_ = (float)(uVar98 ^ auVar37._8_4_);
        auVar80._12_4_ = (float)(uVar99 ^ auVar37._12_4_);
        auVar37 = vcmpps_avx(auVar80,_DAT_01f7aa10,5);
        auVar63 = auVar55 & auVar37;
        if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar63[0xf] < '\0') {
          auVar63 = vandps_avx(auVar65,auVar101);
          auVar55 = vandps_avx(auVar37,auVar55);
          auVar37 = vsubps_avx(auVar63,auVar68);
          auVar37 = vcmpps_avx(auVar37,auVar80,5);
          auVar64 = auVar55 & auVar37;
          if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar64[0xf] < '\0') {
            auVar55 = vandps_avx(auVar37,auVar55);
            auVar33._0_4_ = auVar51._0_4_ * auVar91._0_4_;
            auVar33._4_4_ = auVar51._4_4_ * auVar91._4_4_;
            auVar33._8_4_ = auVar51._8_4_ * auVar91._8_4_;
            auVar33._12_4_ = auVar51._12_4_ * auVar91._12_4_;
            auVar37 = vfmadd132ps_fma(auVar10,auVar33,auVar82);
            auVar37 = vfmadd213ps_fma(auVar9,auVar72,auVar37);
            auVar76._0_4_ = (float)(uVar18 ^ auVar37._0_4_);
            auVar76._4_4_ = (float)(uVar95 ^ auVar37._4_4_);
            auVar76._8_4_ = (float)(uVar98 ^ auVar37._8_4_);
            auVar76._12_4_ = (float)(uVar99 ^ auVar37._12_4_);
            auVar34._0_4_ = auVar63._0_4_ * *(float *)(ray + 0x30);
            auVar34._4_4_ = auVar63._4_4_ * *(float *)(ray + 0x34);
            auVar34._8_4_ = auVar63._8_4_ * *(float *)(ray + 0x38);
            auVar34._12_4_ = auVar63._12_4_ * *(float *)(ray + 0x3c);
            auVar37 = vcmpps_avx(auVar34,auVar76,1);
            _local_37c8 = *(undefined1 (*) [16])(ray + 0x80);
            auVar54._0_4_ = auVar63._0_4_ * *(float *)(ray + 0x80);
            auVar54._4_4_ = auVar63._4_4_ * *(float *)(ray + 0x84);
            auVar54._8_4_ = auVar63._8_4_ * *(float *)(ray + 0x88);
            auVar54._12_4_ = auVar63._12_4_ * *(float *)(ray + 0x8c);
            auVar64 = vcmpps_avx(auVar76,auVar54,2);
            auVar37 = vandps_avx(auVar64,auVar37);
            auVar64 = auVar55 & auVar37;
            if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar64[0xf] < '\0') {
              auVar55 = vandps_avx(auVar55,auVar37);
              auVar37 = vcmpps_avx(auVar65,_DAT_01f7aa10,4);
              auVar64 = auVar55 & auVar37;
              if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar64[0xf] < '\0') {
                auVar55 = vandps_avx(auVar37,auVar55);
                uVar95 = *(uint *)(lVar22 + uVar23 * 4);
                pGVar3 = (context->scene->geometries).items[uVar95].ptr;
                uVar18 = pGVar3->mask;
                auVar35._4_4_ = uVar18;
                auVar35._0_4_ = uVar18;
                auVar35._8_4_ = uVar18;
                auVar35._12_4_ = uVar18;
                auVar37 = vpand_avx(auVar35,*(undefined1 (*) [16])(ray + 0x90));
                auVar37 = vpcmpeqd_avx(auVar37,_DAT_01f7aa10);
                auVar64 = auVar55 & ~auVar37;
                if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar64[0xf] < '\0') {
                  uVar19 = *(undefined4 *)((long)&local_3718 + uVar23 * 4);
                  auVar55 = vandnps_avx(auVar37,auVar55);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar37 = vrcpps_avx(auVar63);
                    auVar86._8_4_ = 0x3f800000;
                    auVar86._0_8_ = 0x3f8000003f800000;
                    auVar86._12_4_ = 0x3f800000;
                    auVar63 = vfnmadd213ps_fma(auVar63,auVar37,auVar86);
                    auVar37 = vfmadd132ps_fma(auVar63,auVar37,auVar37);
                    fVar56 = auVar37._0_4_;
                    auVar36._0_4_ = fVar56 * auVar68._0_4_;
                    fVar60 = auVar37._4_4_;
                    auVar36._4_4_ = fVar60 * auVar68._4_4_;
                    fVar61 = auVar37._8_4_;
                    auVar36._8_4_ = fVar61 * auVar68._8_4_;
                    fVar62 = auVar37._12_4_;
                    auVar36._12_4_ = fVar62 * auVar68._12_4_;
                    auVar37 = vminps_avx(auVar36,auVar86);
                    auVar70._0_4_ = fVar56 * auVar80._0_4_;
                    auVar70._4_4_ = fVar60 * auVar80._4_4_;
                    auVar70._8_4_ = fVar61 * auVar80._8_4_;
                    auVar70._12_4_ = fVar62 * auVar80._12_4_;
                    auVar63 = vminps_avx(auVar70,auVar86);
                    auVar64 = vsubps_avx(auVar86,auVar37);
                    auVar71 = vsubps_avx(auVar86,auVar63);
                    auVar11._8_8_ = uStack_3670;
                    auVar11._0_8_ = local_3678;
                    local_36d8 = vblendvps_avx(auVar37,auVar64,auVar11);
                    local_36c8 = vblendvps_avx(auVar63,auVar71,auVar11);
                    local_36a8._4_4_ = uVar95;
                    local_36a8._0_4_ = uVar95;
                    local_36a8._8_4_ = uVar95;
                    local_36a8._12_4_ = uVar95;
                    local_36b8._4_4_ = uVar19;
                    local_36b8._0_4_ = uVar19;
                    local_36b8._8_4_ = uVar19;
                    local_36b8._12_4_ = uVar19;
                    local_3708[0] = (RTCHitN)auVar72[0];
                    local_3708[1] = (RTCHitN)auVar72[1];
                    local_3708[2] = (RTCHitN)auVar72[2];
                    local_3708[3] = (RTCHitN)auVar72[3];
                    local_3708[4] = (RTCHitN)auVar72[4];
                    local_3708[5] = (RTCHitN)auVar72[5];
                    local_3708[6] = (RTCHitN)auVar72[6];
                    local_3708[7] = (RTCHitN)auVar72[7];
                    local_3708[8] = (RTCHitN)auVar72[8];
                    local_3708[9] = (RTCHitN)auVar72[9];
                    local_3708[10] = (RTCHitN)auVar72[10];
                    local_3708[0xb] = (RTCHitN)auVar72[0xb];
                    local_3708[0xc] = (RTCHitN)auVar72[0xc];
                    local_3708[0xd] = (RTCHitN)auVar72[0xd];
                    local_3708[0xe] = (RTCHitN)auVar72[0xe];
                    local_3708[0xf] = (RTCHitN)auVar72[0xf];
                    local_36f8 = auVar82;
                    local_36e8 = auVar91;
                    vpcmpeqd_avx2(ZEXT1632(local_36d8),ZEXT1632(local_36d8));
                    uStack_3694 = context->user->instID[0];
                    local_3698 = uStack_3694;
                    uStack_3690 = uStack_3694;
                    uStack_368c = uStack_3694;
                    uStack_3688 = context->user->instPrimID[0];
                    auVar42._0_4_ = fVar56 * auVar76._0_4_;
                    auVar42._4_4_ = fVar60 * auVar76._4_4_;
                    auVar42._8_4_ = fVar61 * auVar76._8_4_;
                    auVar42._12_4_ = fVar62 * auVar76._12_4_;
                    uStack_3684 = uStack_3688;
                    uStack_3680 = uStack_3688;
                    uStack_367c = uStack_3688;
                    auVar37 = vblendvps_avx(_local_37c8,auVar42,auVar55);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar37;
                    args.valid = (int *)local_37e8;
                    args.geometryUserPtr = pGVar3->userPtr;
                    args.context = context->user;
                    args.hit = local_3708;
                    args.N = 4;
                    local_37e8 = auVar55;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar3->occlusionFilterN)(&args);
                    }
                    if (local_37e8 == (undefined1  [16])0x0) {
                      auVar55 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar55 = auVar55 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var4)(&args);
                      }
                      auVar37 = vpcmpeqd_avx(local_37e8,_DAT_01f7aa10);
                      auVar55 = auVar37 ^ _DAT_01f7ae20;
                      auVar47._8_4_ = 0xff800000;
                      auVar47._0_8_ = 0xff800000ff800000;
                      auVar47._12_4_ = 0xff800000;
                      auVar37 = vblendvps_avx(auVar47,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar37);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar37;
                    }
                    auVar37 = vpslld_avx(auVar55,0x1f);
                    auVar55 = vpsrad_avx(auVar37,0x1f);
                    auVar37 = vblendvps_avx(_local_37c8,*(undefined1 (*) [16])pRVar1,auVar37);
                    *(undefined1 (*) [16])pRVar1 = auVar37;
                  }
                  auVar49 = vpandn_avx(auVar55,auVar49);
                }
              }
            }
          }
        }
      }
      auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar57 = vpcmpeqd_avx(auVar57,auVar57);
      auVar97 = ZEXT1664(auVar57);
      if (((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar49[0xf])
         || (bVar29 = 2 < uVar23, uVar23 = uVar23 + 1, bVar29)) break;
    }
    auVar57 = vpand_avx(auVar49,auVar50);
    auVar50 = auVar50 & auVar49;
    if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf])
    break;
  }
  aVar38 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar97._0_16_ ^ auVar57);
LAB_005a9008:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar38);
  auVar50 = auVar97._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf])
  goto LAB_005a911d;
  auVar48._8_4_ = 0xff800000;
  auVar48._0_8_ = 0xff800000ff800000;
  auVar48._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                     (undefined1  [16])terminated.field_0);
  goto LAB_005a828c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }